

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typebase.cpp
# Opt level: O3

string * __thiscall
ICM::TypeBase::DisperseType::to_string_abi_cxx11_(string *__return_storage_ptr__,DisperseType *this)

{
  pointer ppOVar1;
  ObjectPtr *in_RDX;
  ObjectPtr *obj;
  pointer ppOVar2;
  string local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  Object *local_38;
  
  ppOVar2 = (this->data).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppOVar1 = (this->data).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (ppOVar2 != ppOVar1) {
    local_38 = *ppOVar2;
    ICM::to_string_abi_cxx11_(&local_60,(ICM *)&local_38,in_RDX);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    ppOVar2 = ppOVar2 + 1;
    if (ppOVar2 != ppOVar1) {
      do {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        local_38 = *ppOVar2;
        ICM::to_string_abi_cxx11_(&local_60,(ICM *)&local_38,obj);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        ppOVar2 = ppOVar2 + 1;
      } while (ppOVar2 != ppOVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string DisperseType::to_string() const {
			return Convert::to_string(data.begin(), data.end(), [](const ObjectPtr &op) { return ICM::to_string(op); });
		}